

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O0

string * cmJoin<cmGraphEdgeList>(string *__return_storage_ptr__,cmGraphEdgeList *r,char *delimiter)

{
  bool bVar1;
  int iVar2;
  reference this;
  undefined1 local_1e8 [32];
  ostream_iterator<cmGraphEdge,_char,_std::char_traits<char>_> local_1c8;
  ostream_iterator<cmGraphEdge,_char,_std::char_traits<char>_> *local_1b8;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_1b0;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_1a8;
  InputIt last;
  InputIt first;
  ostringstream os;
  char *delimiter_local;
  cmGraphEdgeList *r_local;
  
  bVar1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::empty
                    (&r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&first);
    last._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                   (&r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>);
    local_1a8._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end
                   (&r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>);
    __gnu_cxx::
    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
    ::operator--(&local_1a8);
    local_1b0._M_current = last._M_current;
    local_1b8 = (ostream_iterator<cmGraphEdge,_char,_std::char_traits<char>_> *)local_1a8._M_current
    ;
    std::ostream_iterator<cmGraphEdge,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_1c8,(ostream_type *)&first,delimiter);
    std::
    copy<__gnu_cxx::__normal_iterator<cmGraphEdge_const*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>,std::ostream_iterator<cmGraphEdge,char,std::char_traits<char>>>
              ((cmGraphEdge *)local_1e8,local_1b0,local_1b8);
    this = __gnu_cxx::
           __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
           ::operator*(&local_1a8);
    iVar2 = cmGraphEdge::operator_cast_to_int(this);
    std::ostream::operator<<(&first,iVar2);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&first);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& r, const char* delimiter)
{
  if (r.empty())
    {
    return std::string();
    }
  std::ostringstream os;
  typedef typename Range::value_type ValueType;
  typedef typename Range::const_iterator InputIt;
  const InputIt first = r.begin();
  InputIt last = r.end();
  --last;
  std::copy(first, last,
      std::ostream_iterator<ValueType>(os, delimiter));

  os << *last;

  return os.str();
}